

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapInsertIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_value *pValue)

{
  uint nHash_00;
  sxi32 sVar1;
  sxi32 rc;
  sxu32 nHash;
  sxu32 nIdx;
  jx9_value *pObj;
  jx9_hashmap_node *pNode;
  jx9_value *pValue_local;
  sxi64 iKey_local;
  jx9_hashmap *pMap_local;
  
  pNode = (jx9_hashmap_node *)pValue;
  pValue_local = (jx9_value *)iKey;
  iKey_local = (sxi64)pMap;
  _nHash = jx9VmReserveMemObj(pMap->pVm,(sxu32 *)&rc);
  if (_nHash == (jx9_value *)0x0) {
    pMap_local._4_4_ = -1;
  }
  else {
    if (pNode != (jx9_hashmap_node *)0x0) {
      jx9MemObjStore((jx9_value *)pNode,_nHash);
    }
    nHash_00 = (**(code **)(iKey_local + 0x30))(pValue_local);
    pObj = (jx9_value *)HashmapNewIntNode((jx9_hashmap *)iKey_local,(sxi64)pValue_local,nHash_00,rc)
    ;
    if ((jx9_hashmap_node *)pObj == (jx9_hashmap_node *)0x0) {
      pMap_local._4_4_ = -1;
    }
    else {
      sVar1 = HashmapGrowBucket((jx9_hashmap *)iKey_local);
      if (sVar1 == 0) {
        HashmapNodeLink((jx9_hashmap *)iKey_local,(jx9_hashmap_node *)pObj,
                        nHash_00 & *(int *)(iKey_local + 0x28) - 1U);
        pMap_local._4_4_ = 0;
      }
      else {
        SyMemBackendPoolFree(*(SyMemBackend **)iKey_local,pObj);
        pMap_local._4_4_ = sVar1;
      }
    }
  }
  return pMap_local._4_4_;
}

Assistant:

static sxi32 HashmapInsertIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_value *pValue)
{
	jx9_hashmap_node *pNode;
	jx9_value *pObj;
	sxu32 nIdx;
	sxu32 nHash;
	sxi32 rc;
	/* Reserve a jx9_value for the value */
	pObj = jx9VmReserveMemObj(pMap->pVm,&nIdx);
	if( pObj == 0 ){
		return SXERR_MEM;
	}
	if( pValue ){
		/* Duplicate the value */
		jx9MemObjStore(pValue, pObj);
	}	
	/* Hash the key */
	nHash = pMap->xIntHash(iKey);
	/* Allocate a new int node */
	pNode = HashmapNewIntNode(&(*pMap), iKey, nHash, nIdx);
	if( pNode == 0 ){
		return SXERR_MEM;
	}
	/* Make sure the bucket is big enough to hold the new entry */
	rc = HashmapGrowBucket(&(*pMap));
	if( rc != SXRET_OK ){
		SyMemBackendPoolFree(&pMap->pVm->sAllocator, pNode);
		return rc;
	}
	/* Perform the insertion */
	HashmapNodeLink(&(*pMap), pNode, nHash & (pMap->nSize - 1));
	/* All done */
	return SXRET_OK;
}